

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

void calculate_func_cfg_live_info(gen_ctx_t gen_ctx,int freq_p)

{
  VARR_MIR_reg_t **ppVVar1;
  void **ppvVar2;
  char cVar3;
  MIR_reg_t var;
  func_cfg_t pfVar4;
  VARR_reg_info_t *pVVar5;
  bb_t pbVar6;
  void *pvVar7;
  long *plVar8;
  bool bVar9;
  byte bVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  ulong *puVar16;
  gen_ctx_t pgVar17;
  gen_ctx_t pgVar18;
  MIR_insn_t_conflict pMVar19;
  int iVar20;
  ulong uVar21;
  lr_ctx *plVar22;
  int extraout_EDX;
  long lVar23;
  bitmap_t pVVar24;
  ulong uVar25;
  bb_t_conflict pbVar26;
  uint uVar27;
  MIR_module_t_conflict module;
  ulong uVar28;
  bitmap_t pVVar29;
  FILE *__stream;
  size_t sVar30;
  long lVar31;
  MIR_insn_t insn;
  ulong uVar32;
  bool bVar33;
  MIR_reg_t early_clobbered_hard_reg1;
  int local_6c;
  ulong local_68;
  bitmap_t local_60;
  uint local_58;
  uint local_54;
  long local_50;
  long local_48;
  reg_info_t *local_40;
  bitmap_t local_38;
  
  gen_ctx->lr_ctx->ssa_live_info_p = 0;
  pgVar18 = (gen_ctx_t)gen_ctx->ctx;
  module = gen_ctx->curr_func_item->module;
  puVar16 = (ulong *)_MIR_get_module_global_var_hard_regs((MIR_context_t)pgVar18,module);
  pfVar4 = gen_ctx->curr_cfg;
  pVVar5 = pfVar4->reg_info;
  if ((pVVar5 != (VARR_reg_info_t *)0x0) && (pVVar5->varr != (reg_info_t *)0x0)) {
    pVVar5->els_num = 0;
    uVar27 = 0;
    uVar11 = pfVar4->max_var;
    do {
      pVVar5 = gen_ctx->curr_cfg->reg_info;
      pgVar17 = (gen_ctx_t)pVVar5->varr;
      if (pgVar17 == (gen_ctx_t)0x0) {
        calculate_func_cfg_live_info_cold_19();
        goto LAB_0015bb08;
      }
      sVar30 = pVVar5->els_num;
      uVar25 = sVar30 + 1;
      if (pVVar5->size < uVar25) {
        sVar30 = (uVar25 >> 1) + uVar25;
        module = (MIR_module_t_conflict)(sVar30 * 0x10);
        pgVar18 = pgVar17;
        pgVar17 = (gen_ctx_t)realloc(pgVar17,(size_t)module);
        pVVar5->varr = (reg_info_t *)pgVar17;
        pVVar5->size = sVar30;
        sVar30 = pVVar5->els_num;
        uVar25 = sVar30 + 1;
      }
      uVar27 = uVar27 + 1;
      pVVar5->els_num = uVar25;
      pgVar17->call_used_hard_regs[sVar30 * 2 + -0xd] = (bitmap_t)0x0;
      (pgVar17->call_used_hard_regs + sVar30 * 2 + -0xd)[1] = (bitmap_t)0x0;
    } while (uVar27 <= uVar11);
    pbVar26 = (gen_ctx->curr_cfg->bbs).head;
    for (pbVar6 = pbVar26; pbVar6 != (bb_t_conflict)0x0; pbVar6 = (pbVar6->bb_link).next) {
      pVVar24 = pbVar6->in;
      if ((((pVVar24 == (bitmap_t)0x0) ||
           (module = (MIR_module_t_conflict)pbVar6->out, module == (MIR_module_t_conflict)0x0)) ||
          (pgVar18 = (gen_ctx_t)pbVar6->gen, pgVar18 == (gen_ctx_t)0x0)) ||
         (pVVar29 = pbVar6->kill, pVVar29 == (bitmap_t)0x0)) {
        __assert_fail("bb != ((void*)0) && bb->in != ((void*)0) && bb->out != ((void*)0) && bb->gen != ((void*)0) && bb->kill != ((void*)0)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x17bf,"void initiate_live_info(gen_ctx_t, int)");
      }
      if (pVVar24->varr == (bitmap_el_t *)0x0) goto LAB_0015bb08;
      pVVar24->els_num = 0;
      if ((module->items).head == (MIR_item_t_conflict)0x0) goto LAB_0015bb0d;
      module->data = (void *)0x0;
      if (pgVar18->curr_func_item == (MIR_item_t)0x0) goto LAB_0015bb12;
      pgVar18->ctx = (MIR_context_t)0x0;
      if (pVVar29->varr == (bitmap_el_t *)0x0) goto LAB_0015bb17;
      pVVar29->els_num = 0;
    }
    if ((puVar16 != (ulong *)0x0) && (plVar22 = gen_ctx->lr_ctx, plVar22->scan_vars_num == 0)) {
      pVVar24 = ((pbVar26->bb_link).next)->out;
      if (pVVar24 == (bitmap_t)0x0) {
        calculate_func_cfg_live_info_cold_7();
LAB_0015bb77:
        calculate_func_cfg_live_info_cold_8();
LAB_0015bb7c:
        calculate_func_cfg_live_info_cold_9();
LAB_0015bb81:
        iVar20 = (int)plVar22;
        calculate_func_cfg_live_info_cold_5();
        __stream = (FILE *)pgVar18->debug_file;
        if ((__stream != (FILE *)0x0) && (1 < pgVar18->debug_level)) {
          if (extraout_EDX != 0) {
            add_bb_insn_dead_vars(pgVar18);
            __stream = (FILE *)pgVar18->debug_file;
          }
          iVar15 = 0x1b89d6;
          fprintf(__stream,"+++++++++++++%s:\n",module);
          print_loop_tree(pgVar18,iVar15);
          print_CFG(pgVar18,1,iVar20,1,1,output_bb_live_info);
          return;
        }
        return;
      }
      uVar25 = pVVar24->els_num;
      uVar32 = *puVar16;
      if (uVar25 < uVar32) {
        lVar31 = (uVar32 & 0x3ffffffffffffff) - uVar25;
        if ((uVar32 & 0x3ffffffffffffff) < uVar25 || lVar31 == 0) {
          pgVar18 = (gen_ctx_t)pVVar24->varr;
        }
        else {
          pgVar18 = (gen_ctx_t)pVVar24->varr;
          do {
            if (pgVar18 == (gen_ctx_t)0x0) goto LAB_0015bb44;
            sVar30 = pVVar24->els_num;
            uVar25 = sVar30 + 1;
            if (pVVar24->size < uVar25) {
              sVar30 = (uVar25 >> 1) + uVar25;
              pgVar18 = (gen_ctx_t)realloc(pgVar18,sVar30 * 8);
              pVVar24->varr = (bitmap_el_t *)pgVar18;
              pVVar24->size = sVar30;
              sVar30 = pVVar24->els_num;
              uVar25 = sVar30 + 1;
            }
            lVar31 = lVar31 + -1;
            pVVar24->els_num = uVar25;
            pgVar18->call_used_hard_regs[sVar30 - 0xd] = (bitmap_t)0x0;
          } while (lVar31 != 0);
        }
      }
      else {
        pgVar18 = (gen_ctx_t)pVVar24->varr;
        if (pgVar18 == (gen_ctx_t)0x0) goto LAB_0015bb81;
        pVVar24->els_num = uVar32;
      }
      memcpy(pgVar18,(void *)puVar16[2],uVar32 << 3);
    }
    insn = (((gen_ctx->curr_func_item->u).func)->insns).tail;
    if (insn != (MIR_insn_t_conflict)0x0) {
      uVar11 = gen_ctx->optimize_level;
      do {
        if (uVar11 == 0) {
          uVar11 = *(int *)&insn->field_0x18 - 0xa7;
          pMVar19 = insn;
          if ((uVar11 < 0xe) && ((0x2007U >> (uVar11 & 0x1f) & 1) != 0)) {
            pMVar19 = (MIR_insn_t_conflict)insn->data;
          }
        }
        else {
          pMVar19 = (MIR_insn_t_conflict)((long)insn->data + 0x30);
        }
        pvVar7 = pMVar19->data;
        local_38 = (bitmap_t)
                   _MIR_get_module_global_var_hard_regs
                             (gen_ctx->ctx,gen_ctx->curr_func_item->module);
        pVVar5 = gen_ctx->curr_cfg->reg_info;
        if (pVVar5 == (VARR_reg_info_t *)0x0) goto LAB_0015bb49;
        local_40 = pVVar5->varr;
        lVar31 = 1;
        if ((freq_p != 0) && (gen_ctx->optimize_level != 0)) {
          lVar23 = *(long *)((long)pvVar7 + 0x98);
          iVar20 = -2;
          uVar11 = 0;
          do {
            uVar27 = uVar11;
            lVar23 = *(long *)(lVar23 + 0x18);
            iVar20 = iVar20 + 1;
            uVar11 = uVar27 + 1;
          } while (lVar23 != 0);
          if (iVar20 < 0) goto LAB_0015bb53;
          if (iVar20 != 0) {
            lVar31 = 1;
            do {
              if (lVar31 < 0xfffffffffffffff) {
                lVar31 = lVar31 * 5;
              }
              uVar27 = uVar27 - 1;
            } while (1 < uVar27);
          }
        }
        *(undefined8 *)((long)pvVar7 + 0xa0) = 0;
        bVar9 = false;
        iVar15 = 0;
        iVar20 = 0;
        local_50 = 0x7fffffffffffffff - lVar31;
        local_48 = lVar31;
        while( true ) {
          uVar11 = gen_ctx->optimize_level;
          if (uVar11 == 0) {
            uVar27 = *(int *)&insn->field_0x18 - 0xa7;
            pMVar19 = insn;
            if ((uVar27 < 0xe) && ((0x2007U >> (uVar27 & 0x1f) & 1) != 0)) {
              pMVar19 = (MIR_insn_t_conflict)insn->data;
            }
          }
          else {
            pMVar19 = (MIR_insn_t_conflict)((long)insn->data + 0x30);
          }
          if (pMVar19->data != pvVar7) break;
          if (*(int *)&insn->field_0x18 == 0xba) {
            pgVar18 = (gen_ctx_t)gen_ctx->lr_ctx;
            *(undefined4 *)&pgVar18->ctx = 1;
            var = insn->ops[0].u.reg;
            uVar11 = var_to_scan_var(pgVar18,var);
            if (-1 < (int)uVar11) {
              plVar8 = *(long **)((long)pvVar7 + 0x78);
              if (plVar8 == (long *)0x0) goto LAB_0015bb26;
              uVar25 = (ulong)uVar11;
              if (((uVar25 < (ulong)(*plVar8 << 6)) &&
                  (uVar32 = *(ulong *)(plVar8[2] + (ulong)(uVar11 >> 6) * 8),
                  *(ulong *)(plVar8[2] + (ulong)(uVar11 >> 6) * 8) =
                       uVar32 & ~(1L << (uVar25 & 0x3f)), (uVar32 >> (uVar25 & 0x3f) & 1) != 0)) &&
                 (gen_ctx->optimize_level != 0)) {
                iVar12 = int_var_type_p(gen_ctx,var);
                if (iVar12 == 0) {
                  iVar15 = iVar15 + -1;
                }
                else {
                  iVar20 = iVar20 + -1;
                }
              }
              pVVar24 = *(bitmap_t *)((long)pvVar7 + 0x80);
              bitmap_expand(pVVar24,uVar25 + 1);
              if (pVVar24 == (bitmap_t)0x0) goto LAB_0015bb21;
              pVVar24->varr[uVar11 >> 6] = pVVar24->varr[uVar11 >> 6] | 1L << (uVar25 & 0x3f);
            }
          }
          else {
            if ((0xfffffffc < *(int *)&insn->field_0x18 - 0xaaU) &&
               (gen_ctx->lr_ctx->scan_vars_num == 0)) {
              bitmap_ior(*(bitmap_t *)((long)pvVar7 + 0x80),*(bitmap_t *)((long)pvVar7 + 0x80),
                         gen_ctx->call_used_hard_regs[0x12]);
              pVVar24 = *(bitmap_t *)((long)pvVar7 + 0x78);
              if (local_38 == (bitmap_t)0x0) {
                bitmap_and_compl(pVVar24,pVVar24,gen_ctx->call_used_hard_regs[0x12]);
              }
              else {
                bitmap_ior_and_compl(pVVar24,local_38,pVVar24,gen_ctx->call_used_hard_regs[0x12]);
              }
            }
            uVar11 = *(uint *)&insn->field_0x1c;
            local_60 = (bitmap_t)&insn->ops[0].u;
            uVar25 = 0;
            while (sVar30 = uVar25, sVar30 < uVar11) {
              pVVar24 = local_60 + sVar30 * 2;
              while ((MIR_insn_op_mode(gen_ctx->ctx,insn,sVar30,&local_6c), local_6c == 0 ||
                     (*(char *)&pVVar24[-1].varr == '\v'))) {
                sVar30 = sVar30 + 1;
                pVVar24 = pVVar24 + 2;
                if (uVar11 == sVar30) goto LAB_0015b4bb;
              }
              if (*(char *)&pVVar24[-1].varr != '\x02') {
                __assert_fail("op_ref->mode == MIR_OP_VAR",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x4ff,
                              "int output_insn_var_iterator_next(gen_ctx_t, insn_var_iterator_t *, MIR_reg_t *, int *)"
                             );
              }
              uVar27 = (uint)pVVar24->els_num;
              pgVar18 = (gen_ctx_t)gen_ctx->lr_ctx;
              module = (MIR_module_t_conflict)(ulong)uVar27;
              uVar13 = var_to_scan_var(pgVar18,uVar27);
              uVar25 = sVar30 + 1;
              if (-1 < (int)uVar13) {
                plVar22 = *(lr_ctx **)((long)pvVar7 + 0x78);
                if (plVar22 == (lr_ctx *)0x0) goto LAB_0015bb7c;
                lVar31._0_4_ = plVar22->ssa_live_info_p;
                lVar31._4_4_ = plVar22->scan_vars_num;
                uVar25 = (ulong)uVar13;
                if (uVar25 < (ulong)(lVar31 << 6)) {
                  ppVVar1 = &plVar22->scan_var_to_var_map;
                  plVar22 = (lr_ctx *)(ulong)(uVar13 >> 6);
                  uVar32 = (&(*ppVVar1)->els_num)[(long)plVar22];
                  (&(*ppVVar1)->els_num)[(long)plVar22] = uVar32 & ~(1L << (uVar25 & 0x3f));
                  if (((uVar32 >> (uVar25 & 0x3f) & 1) != 0) && (gen_ctx->optimize_level != 0)) {
                    iVar12 = int_var_type_p(gen_ctx,uVar27);
                    if (iVar12 == 0) {
                      iVar15 = iVar15 + -1;
                    }
                    else {
                      iVar20 = iVar20 + -1;
                    }
                  }
                }
                module = (MIR_module_t_conflict)(uVar25 + 1);
                pgVar17 = *(gen_ctx_t *)((long)pvVar7 + 0x80);
                pgVar18 = pgVar17;
                local_68 = uVar25;
                bitmap_expand((bitmap_t)pgVar17,(size_t)module);
                if (pgVar17 == (gen_ctx_t)0x0) goto LAB_0015bb77;
                uVar25 = sVar30 + 1;
                ppvVar2 = &pgVar17->curr_func_item->data + (local_68 >> 6 & 0x3ffffff);
                *ppvVar2 = (void *)((ulong)*ppvVar2 | 1L << (local_68 & 0x3f));
                if ((freq_p != 0) && (0x21 < uVar27)) {
                  lVar31 = local_40[uVar27].freq + local_48;
                  if (local_50 <= local_40[uVar27].freq) {
                    lVar31 = 0x7fffffffffffffff;
                  }
                  local_40[uVar27].freq = lVar31;
                }
              }
            }
LAB_0015b4bb:
            uVar11 = *(uint *)&insn->field_0x1c;
            sVar30 = 0;
            uVar25 = 0;
            while (sVar30 < uVar11) {
LAB_0015b4d2:
              MIR_insn_op_mode(gen_ctx->ctx,insn,sVar30,&local_6c);
              if ((local_6c != 0) && (insn->ops[sVar30].field_0x8 != '\v')) goto LAB_0015b549;
              if (1 < uVar25) {
LAB_0015b547:
                uVar25 = 0;
LAB_0015b549:
                sVar30 = sVar30 + 1;
                if (sVar30 == uVar11) break;
                goto LAB_0015b4d2;
              }
              cVar3 = insn->ops[sVar30].field_0x8;
              if (cVar3 == '\v') {
                do {
                  uVar27 = *(uint *)((long)&insn->ops[sVar30].u + (ulong)(uVar25 != 0) * 4 + 0x10);
                  if (uVar27 != 0xffffffff) {
                    uVar25 = uVar25 + 1;
                    goto LAB_0015b559;
                  }
                  bVar33 = uVar25 == 0;
                  uVar25 = 1;
                } while (bVar33);
                goto LAB_0015b547;
              }
              if (uVar25 == 1) goto LAB_0015b547;
              uVar25 = 0;
              if (cVar3 != '\x02') goto LAB_0015b549;
              uVar27 = insn->ops[sVar30].u.reg;
              uVar25 = 1;
LAB_0015b559:
              uVar13 = var_to_scan_var((gen_ctx_t)gen_ctx->lr_ctx,uVar27);
              if (-1 < (int)uVar13) {
                local_68 = (ulong)uVar13;
                local_60 = *(bitmap_t *)((long)pvVar7 + 0x78);
                bitmap_expand(local_60,local_68 + 1);
                if (local_60 == (bitmap_t)0x0) goto LAB_0015bb4e;
                uVar21 = local_68 >> 6 & 0x3ffffff;
                uVar32 = local_60->varr[uVar21];
                local_60->varr[uVar21] = uVar32 | 1L << (local_68 & 0x3f);
                if (((uVar32 >> (local_68 & 0x3f) & 1) == 0) && (gen_ctx->optimize_level != 0)) {
                  iVar12 = int_var_type_p(gen_ctx,uVar27);
                  if (iVar12 == 0) {
                    iVar12 = iVar15 + 1;
                    bVar33 = *(int *)((long)pvVar7 + 0xa4) <= iVar15;
                    iVar15 = iVar12;
                    if (bVar33) {
                      *(int *)((long)pvVar7 + 0xa4) = iVar12;
                    }
                  }
                  else {
                    iVar12 = iVar20 + 1;
                    bVar33 = *(int *)((long)pvVar7 + 0xa0) <= iVar20;
                    iVar20 = iVar12;
                    if (bVar33) {
                      *(int *)((long)pvVar7 + 0xa0) = iVar12;
                    }
                  }
                }
                if ((freq_p != 0) && (0x21 < uVar27)) {
                  lVar31 = local_40[uVar27].freq + local_48;
                  if (local_50 <= local_40[uVar27].freq) {
                    lVar31 = 0x7fffffffffffffff;
                  }
                  local_40[uVar27].freq = lVar31;
                }
              }
            }
            if (gen_ctx->lr_ctx->scan_vars_num == 0) {
              target_get_early_clobbered_hard_regs
                        (*(MIR_insn_t *)&insn->field_0x18,&local_54,&local_58);
              uVar11 = local_54;
              uVar25 = (ulong)local_54;
              if (uVar25 != 0xffffffff) {
                if (gen_ctx->optimize_level != 0) {
                  iVar12 = int_var_type_p(gen_ctx,local_54);
                  if (iVar12 == 0) {
                    bVar9 = false;
                    iVar12 = iVar15 + 1;
                    bVar33 = *(int *)((long)pvVar7 + 0xa4) <= iVar15;
                    iVar15 = iVar12;
                    if (bVar33) {
                      *(int *)((long)pvVar7 + 0xa4) = iVar12;
                    }
                  }
                  else {
                    bVar9 = true;
                    iVar12 = iVar20 + 1;
                    bVar33 = *(int *)((long)pvVar7 + 0xa0) <= iVar20;
                    iVar20 = iVar12;
                    if (bVar33) {
                      *(int *)((long)pvVar7 + 0xa0) = iVar12;
                    }
                  }
                }
                plVar8 = *(long **)((long)pvVar7 + 0x78);
                if (plVar8 == (long *)0x0) goto LAB_0015bb30;
                if (uVar25 < (ulong)(*plVar8 << 6)) {
                  bVar10 = (byte)uVar11 & 0x3f;
                  puVar16 = (ulong *)(plVar8[2] + (ulong)(uVar11 >> 6) * 8);
                  *puVar16 = *puVar16 & (-2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10);
                }
                pVVar24 = *(bitmap_t *)((long)pvVar7 + 0x80);
                bitmap_expand(pVVar24,uVar25 + 1);
                if (pVVar24 == (bitmap_t)0x0) goto LAB_0015bb2b;
                pVVar24->varr[uVar11 >> 6] = pVVar24->varr[uVar11 >> 6] | 1L << (uVar25 & 0x3f);
                if (gen_ctx->optimize_level != 0) {
                  if (bVar9) {
                    iVar20 = iVar20 + -1;
                    bVar9 = true;
                  }
                  else {
                    bVar9 = false;
                    iVar15 = iVar15 + -1;
                  }
                }
              }
              uVar11 = local_58;
              uVar25 = (ulong)local_58;
              if (uVar25 != 0xffffffff) {
                iVar12 = iVar15;
                if (gen_ctx->optimize_level != 0) {
                  iVar14 = int_var_type_p(gen_ctx,local_58);
                  if (iVar14 == 0) {
                    bVar9 = false;
                    iVar12 = iVar15 + 1;
                    if (*(int *)((long)pvVar7 + 0xa4) <= iVar15) {
                      *(int *)((long)pvVar7 + 0xa4) = iVar12;
                    }
                  }
                  else {
                    iVar15 = iVar20 + 1;
                    bVar9 = true;
                    bVar33 = *(int *)((long)pvVar7 + 0xa0) <= iVar20;
                    iVar20 = iVar15;
                    if (bVar33) {
                      *(int *)((long)pvVar7 + 0xa0) = iVar15;
                    }
                  }
                }
                plVar8 = *(long **)((long)pvVar7 + 0x78);
                if (plVar8 == (long *)0x0) goto LAB_0015bb3a;
                if (uVar25 < (ulong)(*plVar8 << 6)) {
                  bVar10 = (byte)uVar11 & 0x3f;
                  puVar16 = (ulong *)(plVar8[2] + (ulong)(uVar11 >> 6) * 8);
                  *puVar16 = *puVar16 & (-2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10);
                }
                pVVar24 = *(bitmap_t *)((long)pvVar7 + 0x80);
                bitmap_expand(pVVar24,uVar25 + 1);
                if (pVVar24 == (bitmap_t)0x0) goto LAB_0015bb35;
                pVVar24->varr[uVar11 >> 6] = pVVar24->varr[uVar11 >> 6] | 1L << (uVar25 & 0x3f);
                iVar15 = iVar12;
                if (gen_ctx->optimize_level != 0) {
                  if (bVar9) {
                    bVar9 = true;
                    iVar20 = iVar20 + -1;
                  }
                  else {
                    bVar9 = false;
                    iVar15 = iVar12 + -1;
                  }
                }
              }
              if (0xfffffffc < *(int *)&insn->field_0x18 - 0xaaU) {
                if (gen_ctx->optimize_level == 0) {
                  pVVar24 = *(bitmap_t *)((long)insn->data + 8);
                  if (pVVar24 == (bitmap_t)0x0) goto LAB_0015b9a0;
                  pVVar29 = *(bitmap_t *)((long)pvVar7 + 0x78);
                }
                else {
                  pVVar29 = *(bitmap_t *)((long)pvVar7 + 0x78);
                  pVVar24 = *(bitmap_t *)((long)insn->data + 0x48);
                }
                bitmap_ior(pVVar29,pVVar29,pVVar24);
              }
            }
          }
LAB_0015b9a0:
          insn = (insn->insn_link).prev;
          if (insn == (MIR_insn_t)0x0) goto LAB_0015b9ad;
        }
      } while( true );
    }
LAB_0015b9ad:
    solve_dataflow(gen_ctx,0,live_con_func_0,live_con_func_n,live_trans_func);
    if (gen_ctx->optimize_level != 0) {
      for (pbVar26 = (gen_ctx->curr_cfg->bbs).head; pbVar26 != (bb_t_conflict)0x0;
          pbVar26 = (pbVar26->bb_link).next) {
        pVVar24 = pbVar26->out;
        if (pVVar24 == (bitmap_t)0x0) goto LAB_0015bb1c;
        uVar25 = pVVar24->els_num;
        if (uVar25 != 0) {
          iVar20 = pbVar26->max_int_pressure;
          iVar15 = pbVar26->max_fp_pressure;
          uVar21 = 0;
          uVar32 = 0;
          do {
            while ((pVVar24->varr[uVar21] == 0 ||
                   (uVar28 = pVVar24->varr[uVar21] >> (uVar32 & 0x3f), uVar28 == 0))) {
              uVar21 = uVar21 + 1;
              uVar32 = uVar21 * 0x40;
              if (uVar25 == uVar21) goto LAB_0015baad;
            }
            uVar25 = uVar28 & 1;
            while (uVar25 == 0) {
              uVar32 = uVar32 + 1;
              uVar25 = uVar28 & 2;
              uVar28 = uVar28 >> 1;
            }
            iVar12 = int_var_type_p(gen_ctx,(MIR_reg_t)uVar32);
            if (iVar12 == 0) {
              iVar12 = iVar15 + 1;
              bVar9 = pbVar26->max_fp_pressure <= iVar15;
              iVar15 = iVar12;
              if (bVar9) {
                pbVar26->max_fp_pressure = iVar12;
              }
            }
            else {
              iVar12 = iVar20 + 1;
              bVar9 = pbVar26->max_int_pressure <= iVar20;
              iVar20 = iVar12;
              if (bVar9) {
                pbVar26->max_int_pressure = iVar12;
              }
            }
            uVar25 = pVVar24->els_num;
            uVar32 = uVar32 + 1;
            uVar21 = uVar32 >> 6;
          } while (uVar21 < uVar25);
        }
LAB_0015baad:
      }
    }
    return;
  }
  goto LAB_0015bb3f;
LAB_0015bb08:
  calculate_func_cfg_live_info_cold_4();
LAB_0015bb0d:
  calculate_func_cfg_live_info_cold_3();
LAB_0015bb12:
  calculate_func_cfg_live_info_cold_2();
LAB_0015bb17:
  calculate_func_cfg_live_info_cold_1();
LAB_0015bb1c:
  calculate_func_cfg_live_info_cold_18();
LAB_0015bb21:
  calculate_func_cfg_live_info_cold_15();
LAB_0015bb26:
  calculate_func_cfg_live_info_cold_16();
LAB_0015bb2b:
  calculate_func_cfg_live_info_cold_11();
LAB_0015bb30:
  calculate_func_cfg_live_info_cold_12();
LAB_0015bb35:
  calculate_func_cfg_live_info_cold_13();
LAB_0015bb3a:
  calculate_func_cfg_live_info_cold_14();
LAB_0015bb3f:
  calculate_func_cfg_live_info_cold_20();
LAB_0015bb44:
  calculate_func_cfg_live_info_cold_6();
LAB_0015bb49:
  calculate_func_cfg_live_info_cold_17();
LAB_0015bb4e:
  calculate_func_cfg_live_info_cold_10();
LAB_0015bb53:
  __assert_fail("level >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x1748,"int bb_loop_level(bb_t)");
}

Assistant:

static void calculate_func_cfg_live_info (gen_ctx_t gen_ctx, int freq_p) {
  ssa_live_info_p = FALSE;
  initiate_live_info (gen_ctx, freq_p);
  solve_dataflow (gen_ctx, FALSE, live_con_func_0, live_con_func_n, live_trans_func);
  if (optimize_level != 0) update_bb_pressure (gen_ctx);
}